

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::FindFilesToPrune
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune,
          int last_prune,Chainstate *chain,ChainstateManager *chainman)

{
  uint uVar1;
  ulong uVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer pCVar5;
  string_view source_file;
  bool bVar6;
  byte bVar7;
  char *pcVar8;
  uint64_t uVar9;
  Logger *pLVar10;
  long lVar11;
  BlockfileCursor BVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  BlockfileCursor BVar16;
  int iVar17;
  int iVar18;
  char *pcVar19;
  long lVar20;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int count;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  string log_msg;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  char *local_140;
  unsigned_long local_128;
  ulong local_120;
  ulong local_118;
  ChainstateRole local_110;
  int local_10c;
  pair<int,_int> local_108 [2];
  unique_lock<std::recursive_mutex> local_f8;
  unique_lock<std::recursive_mutex> local_e8 [7];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8[0]._M_device = &cs_main.super_recursive_mutex;
  local_e8[0]._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(local_e8);
  local_f8._M_owns = false;
  local_f8._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_f8);
  uVar2 = (this->m_opts).prune_target;
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_58,chainman);
  pcVar8 = (char *)(uVar2 / (ulong)((long)(local_58._M_string_length -
                                          (long)local_58._M_dataplus._M_p) >> 3));
  pcVar19 = (char *)0x22600000;
  if ((char *)0x22600000 < pcVar8) {
    pcVar19 = pcVar8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) - (long)local_58._M_dataplus._M_p);
  }
  iVar15 = (int)((ulong)((long)(chain->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(chain->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((0 < iVar15) && (((chainman->m_options).chainparams)->nPruneAfterHeight < (ulong)(iVar15 - 1))
     ) {
    uVar1 = chainman->m_best_header->nHeight;
    local_108[0] = ChainstateManager::GetPruneRange(chainman,chain,last_prune);
    uVar9 = CalculateCurrentUsage(this);
    local_10c = 0;
    if (pcVar19 <=
        "void boost::signals2::detail::signal_impl<void (const uint256 &, ChangeType), boost::signals2::optional_last_value<void>, int, std::less<int>, boost::function<void (const uint256 &, ChangeType)>, boost::function<void (const boost::signals2::connection &, const uint256 &, ChangeType)>, boost::signals2::mutex>::nolock_cleanup_connections_from(garbage_collecting_lock<mutex_type> &, bool, const typename connection_list_type::iterator &, unsigned int) const [Signature = void (const uint256 &, ChangeType), Combiner = boost::signals2::optional_last_value<void>, Group = int, GroupCompare = std::less<int>, SlotFunction = boost::function<void (const uint256 &, ChangeType)>, ExtendedSlotFunction = boost::function<void (const boost::signals2::connection &, const uint256 &, ChangeType)>, Mutex = boost::signals2::mutex]"
        + uVar9 + 0x2ec) {
      ppCVar3 = (chain->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppCVar4 = (chain->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar6 = ChainstateManager::IsInitialBlockDownload(chainman);
      uVar14 = (int)((ulong)((long)ppCVar3 - (long)ppCVar4) >> 3) - 1;
      local_140 = "ion &, const uint256 &, ChangeType)>, Mutex = boost::signals2::mutex]";
      if (bVar6 && uVar14 < uVar1) {
        local_140 = "void boost::signals2::detail::signal_impl<void (const uint256 &, ChangeType), boost::signals2::optional_last_value<void>, int, std::less<int>, boost::function<void (const uint256 &, ChangeType)>, boost::function<void (const boost::signals2::connection &, const uint256 &, ChangeType)>, boost::signals2::mutex>::nolock_cleanup_connections_from(garbage_collecting_lock<mutex_type> &, bool, const typename connection_list_type::iterator &, unsigned int) const [Signature = void (const uint256 &, ChangeType), Combiner = boost::signals2::optional_last_value<void>, Group = int, GroupCompare = std::less<int>, SlotFunction = boost::function<void (const uint256 &, ChangeType)>, ExtendedSlotFunction = boost::function<void (const boost::signals2::connection &, const uint256 &, ChangeType)>, Mutex = boost::signals2::mutex]"
                    + ((long)(int)uVar1 - (long)(int)uVar14) * 1000000 + 0x2ec;
      }
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
      bVar7 = (this->m_blockfile_cursors)._M_elems[0].
              super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
              super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
      BVar12 = (this->m_blockfile_cursors)._M_elems[0].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
      iVar15 = BVar12.file_num;
      if ((bool)bVar7 == false) {
        iVar15 = 0;
      }
      bVar13 = (this->m_blockfile_cursors)._M_elems[1].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
      BVar16 = (this->m_blockfile_cursors)._M_elems[1].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
      iVar17 = BVar16.file_num;
      if ((bool)bVar13 == false) {
        iVar17 = 0;
      }
      if (iVar17 < iVar15) {
        iVar17 = iVar15;
      }
      if (0 < iVar17) {
        iVar15 = 0;
        do {
          pCVar5 = (this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = pCVar5[iVar15].nSize;
          if (uVar1 != 0) {
            if (local_140 + uVar9 < pcVar19) break;
            if ((pCVar5[iVar15].nHeightLast <= (uint)local_108[0].second) &&
               ((uint)local_108[0].first <= pCVar5[iVar15].nHeightFirst)) {
              uVar14 = pCVar5[iVar15].nUndoSize;
              PruneOneBlockFile(this,iVar15);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )setFilesToPrune,(int *)&local_58);
              uVar9 = uVar9 - (uVar1 + uVar14);
              local_10c = local_10c + 1;
              bVar7 = (this->m_blockfile_cursors)._M_elems[0].
                      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                      super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
              BVar12 = (this->m_blockfile_cursors)._M_elems[0].
                       super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                       super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
              bVar13 = (this->m_blockfile_cursors)._M_elems[1].
                       super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                       super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
              BVar16 = (this->m_blockfile_cursors)._M_elems[1].
                       super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                       super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
              iVar15 = (int)local_58._M_dataplus._M_p;
            }
          }
          iVar15 = iVar15 + 1;
          local_58._M_dataplus._M_p._0_4_ = iVar15;
          iVar17 = 0;
          if ((bVar7 & 1) != 0) {
            iVar17 = BVar12.file_num;
          }
          iVar18 = BVar16.file_num;
          if ((bVar13 & 1) == 0) {
            iVar18 = 0;
          }
          if (iVar18 < iVar17) {
            iVar18 = iVar17;
          }
        } while (iVar15 < iVar18);
      }
    }
    pLVar10 = LogInstance();
    bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,PRUNE,Debug);
    if (bVar6) {
      local_110 = Chainstate::GetRole(chain);
      local_118 = (ulong)pcVar19 >> 0x14;
      lVar20 = (long)pcVar19 - uVar9;
      local_120 = uVar9 >> 0x14;
      lVar11 = lVar20 + 0xfffff;
      if (-1 < lVar20) {
        lVar11 = lVar20;
      }
      local_128 = lVar11 >> 0x14;
      pLVar10 = LogInstance();
      bVar6 = BCLog::Logger::Enabled(pLVar10);
      if (bVar6) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
                  (&local_78,
                   (tinyformat *)
                   "[%s] target=%dMiB actual=%dMiB diff=%dMiB min_height=%d max_prune_height=%d removed %d blk/rev pairs\n"
                   ,(char *)&local_110,(ChainstateRole *)&local_118,&local_120,&local_128,
                   (long *)local_108,&local_108[0].second,&local_10c,
                   (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar10 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5e;
        local_78._M_string_length = 0xfa6684;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "FindFilesToPrune";
        logging_function._M_len = 0x10;
        BCLog::Logger::LogPrintStr(pLVar10,str,logging_function,source_file,0x175,PRUNE,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::FindFilesToPrune(
    std::set<int>& setFilesToPrune,
    int last_prune,
    const Chainstate& chain,
    ChainstateManager& chainman)
{
    LOCK2(cs_main, cs_LastBlockFile);
    // Distribute our -prune budget over all chainstates.
    const auto target = std::max(
        MIN_DISK_SPACE_FOR_BLOCK_FILES, GetPruneTarget() / chainman.GetAll().size());
    const uint64_t target_sync_height = chainman.m_best_header->nHeight;

    if (chain.m_chain.Height() < 0 || target == 0) {
        return;
    }
    if (static_cast<uint64_t>(chain.m_chain.Height()) <= chainman.GetParams().PruneAfterHeight()) {
        return;
    }

    const auto [min_block_to_prune, last_block_can_prune] = chainman.GetPruneRange(chain, last_prune);

    uint64_t nCurrentUsage = CalculateCurrentUsage();
    // We don't check to prune until after we've allocated new space for files
    // So we should leave a buffer under our target to account for another allocation
    // before the next pruning.
    uint64_t nBuffer = BLOCKFILE_CHUNK_SIZE + UNDOFILE_CHUNK_SIZE;
    uint64_t nBytesToPrune;
    int count = 0;

    if (nCurrentUsage + nBuffer >= target) {
        // On a prune event, the chainstate DB is flushed.
        // To avoid excessive prune events negating the benefit of high dbcache
        // values, we should not prune too rapidly.
        // So when pruning in IBD, increase the buffer to avoid a re-prune too soon.
        const auto chain_tip_height = chain.m_chain.Height();
        if (chainman.IsInitialBlockDownload() && target_sync_height > (uint64_t)chain_tip_height) {
            // Since this is only relevant during IBD, we assume blocks are at least 1 MB on average
            static constexpr uint64_t average_block_size = 1000000;  /* 1 MB */
            const uint64_t remaining_blocks = target_sync_height - chain_tip_height;
            nBuffer += average_block_size * remaining_blocks;
        }

        for (int fileNumber = 0; fileNumber < this->MaxBlockfileNum(); fileNumber++) {
            const auto& fileinfo = m_blockfile_info[fileNumber];
            nBytesToPrune = fileinfo.nSize + fileinfo.nUndoSize;

            if (fileinfo.nSize == 0) {
                continue;
            }

            if (nCurrentUsage + nBuffer < target) { // are we below our target?
                break;
            }

            // don't prune files that could have a block that's not within the allowable
            // prune range for the chain being pruned.
            if (fileinfo.nHeightLast > (unsigned)last_block_can_prune || fileinfo.nHeightFirst < (unsigned)min_block_to_prune) {
                continue;
            }

            PruneOneBlockFile(fileNumber);
            // Queue up the files for removal
            setFilesToPrune.insert(fileNumber);
            nCurrentUsage -= nBytesToPrune;
            count++;
        }
    }

    LogDebug(BCLog::PRUNE, "[%s] target=%dMiB actual=%dMiB diff=%dMiB min_height=%d max_prune_height=%d removed %d blk/rev pairs\n",
             chain.GetRole(), target / 1024 / 1024, nCurrentUsage / 1024 / 1024,
             (int64_t(target) - int64_t(nCurrentUsage)) / 1024 / 1024,
             min_block_to_prune, last_block_can_prune, count);
}